

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser2.c
# Opt level: O3

void NodeDumpObject(node *p,textwriter_conflict *Text)

{
  uint uVar1;
  long lVar2;
  char *pcVar3;
  tchar_t Element [8];
  textwriter_conflict Level;
  array local_78;
  node *local_60;
  tchar_t local_58 [8];
  textwriter_conflict local_50;
  
  local_60 = p;
  uVar1 = NodeClassFlags(p);
  if ((uVar1 & 0x10) == 0) {
    if (p == (node *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x486,"void NodeDumpObject(node *, textwriter *)");
    }
    FourCCToString(local_58,8,*(fourcc_t *)((long)p->VMT + 8));
    TextElementBegin(&local_50,Text,local_58);
    TextAttribEx(&local_50,"Addr",&local_60,0,0xf);
    TextSerializeNode(&local_50,local_60,0x40000,0);
    local_78._Begin = (char *)0x0;
    local_78._Used = 0;
    if (local_60 == (node *)0x0) {
      __assert_fail("(const void*)(p)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/parser/parser2.c"
                    ,0x48b,"void NodeDumpObject(node *, textwriter *)");
    }
    lVar2 = (**(code **)((long)local_60->VMT + 0x18))(local_60,0xd,&local_78,0x10);
    if ((lVar2 == 0) && (7 < local_78._Used)) {
      pcVar3 = local_78._Begin;
      do {
        NodeDumpObject(*(node **)pcVar3,&local_50);
        pcVar3 = pcVar3 + 8;
      } while (pcVar3 != local_78._Begin + (local_78._Used & 0xfffffffffffffff8));
    }
    ArrayClear(&local_78);
    TextElementEnd(&local_50);
  }
  return;
}

Assistant:

static void NodeDumpObject(node* p,textwriter* Text)
{
    textwriter Level;
    array Children;
    tchar_t Element[8];
    node** i;

    if (!(NodeClassFlags(p) & CFLAG_LOCAL)) // example skin UI stuff
    {
        FourCCToString(Element,TSIZEOF(Element),Node_ClassId(p));
        TextElementBegin(&Level,Text,Element);
        TextAttrib(&Level,T("Addr"),&p,TYPE_PTR);
        TextSerializeNode(&Level,p,TFLAG_NODUMP,0);
        ArrayInit(&Children);
        if (Node_GET(p,NODE_CHILDREN,&Children)==ERR_NONE)
            for (i=ARRAYBEGIN(Children,node*);i!=ARRAYEND(Children,node*);++i)
                NodeDumpObject(*i,&Level);
        ArrayClear(&Children);
        TextElementEnd(&Level);
    }
}